

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

xformAtomRecords *
deleteXformAtomRecord(xformAtomRecords *xr,abrAtomListProc *delAtomProc,void *deletestuff)

{
  xformAtomRecords *pxVar1;
  
  if (xr == (xformAtomRecords *)0x0) {
    pxVar1 = (xformAtomRecords *)0x0;
  }
  else {
    if (xr->a != (atom *)0x0) {
      (*delAtomProc)(xr->a,deletestuff);
    }
    pxVar1 = xr->next;
    free(xr);
  }
  return pxVar1;
}

Assistant:

xformAtomRecords* deleteXformAtomRecord(xformAtomRecords *xr,
            abrAtomListProc delAtomProc, void *deletestuff) {
   xformAtomRecords* following = NULL;
   if (xr) {
      if (xr->a != NULL) {
         delAtomProc(xr->a, deletestuff);
         xr->a = NULL;
      }

      following = xr->next;
      xr->next  = NULL;
      free(xr);
   }
   return following;
}